

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O2

void cnpy::npz_save<double>
               (string *zipname,string *fname,double *data,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *shape,string *mode)

{
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  FILE *__stream;
  pointer pcVar4;
  pointer puVar5;
  runtime_error *this;
  int iVar6;
  ulong uVar7;
  uint16_t nrecs;
  vector<char,_std::allocator<char>_> local_header;
  vector<char,_std::allocator<char>_> global_header;
  size_t global_header_offset;
  vector<char,_std::allocator<char>_> footer;
  vector<char,_std::allocator<char>_> npy_header;
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::append((char *)fname);
  nrecs = 0;
  global_header_offset = 0;
  global_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  global_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  global_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = std::operator==(mode,"a");
  if (bVar1) {
    __stream = fopen((zipname->_M_dataplus)._M_p,"r+b");
    if (__stream != (FILE *)0x0) {
      cnpy::parse_zip_footer(__stream,&nrecs,(ulong *)&npy_header,&global_header_offset);
      fseek(__stream,global_header_offset,0);
      std::vector<char,_std::allocator<char>_>::resize
                (&global_header,
                 (size_type)
                 npy_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      pcVar4 = (pointer)fread(global_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,1,
                              (size_t)npy_header.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,__stream);
      if (pcVar4 != npy_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,"npz_save: header read error while adding to existing zip");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      fseek(__stream,global_header_offset,0);
      goto LAB_00104feb;
    }
  }
  __stream = fopen((zipname->_M_dataplus)._M_p,"wb");
LAB_00104feb:
  create_npy_header<double>(&npy_header,shape);
  iVar6 = 1;
  for (puVar5 = (shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar5 != (shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
    iVar6 = iVar6 * (int)*puVar5;
  }
  uVar7 = (long)npy_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)npy_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar2 = crc32(0,npy_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,uVar7 & 0xffffffff);
  uVar3 = crc32(uVar2,data,(long)iVar6 * 8);
  local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cnpy::operator+=((vector *)&local_header,"PK");
  operator+=(&local_header,0x403);
  operator+=(&local_header,0x14);
  operator+=(&local_header,0);
  operator+=(&local_header,0);
  operator+=(&local_header,0);
  operator+=(&local_header,0);
  operator+=(&local_header,uVar3);
  uVar3 = (int)uVar7 + iVar6 * 8;
  operator+=(&local_header,uVar3);
  operator+=(&local_header,uVar3);
  operator+=(&local_header,(unsigned_short)fname->_M_string_length);
  operator+=(&local_header,0);
  std::__cxx11::string::string(local_50,(string *)fname);
  cnpy::operator+=(&local_header,local_50);
  std::__cxx11::string::~string(local_50);
  cnpy::operator+=((vector *)&global_header,"PK");
  operator+=(&global_header,0x201);
  operator+=(&global_header,0x14);
  std::vector<char,std::allocator<char>>::
  insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((vector<char,std::allocator<char>> *)&global_header,
             (const_iterator)
             global_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 4),
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x1e));
  operator+=(&global_header,0);
  operator+=(&global_header,0);
  operator+=(&global_header,0);
  operator+=(&global_header,0);
  operator+=(&global_header,(uint)global_header_offset);
  std::__cxx11::string::string(local_70,(string *)fname);
  cnpy::operator+=(&global_header,local_70);
  std::__cxx11::string::~string(local_70);
  footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cnpy::operator+=((vector *)&footer,"PK");
  operator+=(&footer,0x605);
  operator+=(&footer,0);
  operator+=(&footer,0);
  operator+=(&footer,nrecs + 1);
  operator+=(&footer,nrecs + 1);
  operator+=(&footer,(int)global_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)global_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  operator+=(&footer,(uVar3 + (uint)global_header_offset +
                     (int)local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish) -
                     (int)local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  operator+=(&footer,0);
  fwrite(local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start,1,
         (long)local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fwrite(npy_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,1,
         (long)npy_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)npy_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fwrite(data,8,(long)iVar6,__stream);
  fwrite(global_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start,1,
         (long)global_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)global_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fwrite(footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,1,
         (long)footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fclose(__stream);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&footer.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&local_header.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&npy_header.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&global_header.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void npz_save(std::string zipname, std::string fname, const T* data, const std::vector<size_t>& shape, std::string mode = "w")
    {
        //first, append a .npy to the fname
        fname += ".npy";

        //now, on with the show
        FILE* fp = NULL;
        uint16_t nrecs = 0;
        size_t global_header_offset = 0;
        std::vector<char> global_header;

        if(mode == "a") fp = fopen(zipname.c_str(),"r+b");

        if(fp) {
            //zip file exists. we need to add a new npy file to it.
            //first read the footer. this gives us the offset and size of the global header
            //then read and store the global header.
            //below, we will write the the new data at the start of the global header then append the global header and footer below it
            size_t global_header_size;
            parse_zip_footer(fp,nrecs,global_header_size,global_header_offset);
            fseek(fp,global_header_offset,SEEK_SET);
            global_header.resize(global_header_size);
            size_t res = fread(&global_header[0],sizeof(char),global_header_size,fp);
            if(res != global_header_size){
                throw std::runtime_error("npz_save: header read error while adding to existing zip");
            }
            fseek(fp,global_header_offset,SEEK_SET);
        }
        else {
            fp = fopen(zipname.c_str(),"wb");
        }

        std::vector<char> npy_header = create_npy_header<T>(shape);

        size_t nels = std::accumulate(shape.begin(),shape.end(),1,std::multiplies<size_t>());
        size_t nbytes = nels*sizeof(T) + npy_header.size();

        //get the CRC of the data to be added
        uint32_t crc = crc32(0L,(uint8_t*)&npy_header[0],npy_header.size());
        crc = crc32(crc,(uint8_t*)data,nels*sizeof(T));

        //build the local header
        std::vector<char> local_header;
        local_header += "PK"; //first part of sig
        local_header += (uint16_t) 0x0403; //second part of sig
        local_header += (uint16_t) 20; //min version to extract
        local_header += (uint16_t) 0; //general purpose bit flag
        local_header += (uint16_t) 0; //compression method
        local_header += (uint16_t) 0; //file last mod time
        local_header += (uint16_t) 0;     //file last mod date
        local_header += (uint32_t) crc; //crc
        local_header += (uint32_t) nbytes; //compressed size
        local_header += (uint32_t) nbytes; //uncompressed size
        local_header += (uint16_t) fname.size(); //fname length
        local_header += (uint16_t) 0; //extra field length
        local_header += fname;

        //build global header
        global_header += "PK"; //first part of sig
        global_header += (uint16_t) 0x0201; //second part of sig
        global_header += (uint16_t) 20; //version made by
        global_header.insert(global_header.end(),local_header.begin()+4,local_header.begin()+30);
        global_header += (uint16_t) 0; //file comment length
        global_header += (uint16_t) 0; //disk number where file starts
        global_header += (uint16_t) 0; //internal file attributes
        global_header += (uint32_t) 0; //external file attributes
        global_header += (uint32_t) global_header_offset; //relative offset of local file header, since it begins where the global header used to begin
        global_header += fname;

        //build footer
        std::vector<char> footer;
        footer += "PK"; //first part of sig
        footer += (uint16_t) 0x0605; //second part of sig
        footer += (uint16_t) 0; //number of this disk
        footer += (uint16_t) 0; //disk where footer starts
        footer += (uint16_t) (nrecs+1); //number of records on this disk
        footer += (uint16_t) (nrecs+1); //total number of records
        footer += (uint32_t) global_header.size(); //nbytes of global headers
        footer += (uint32_t) (global_header_offset + nbytes + local_header.size()); //offset of start of global headers, since global header now starts after newly written array
        footer += (uint16_t) 0; //zip file comment length

        //write everything
        fwrite(&local_header[0],sizeof(char),local_header.size(),fp);
        fwrite(&npy_header[0],sizeof(char),npy_header.size(),fp);
        fwrite(data,sizeof(T),nels,fp);
        fwrite(&global_header[0],sizeof(char),global_header.size(),fp);
        fwrite(&footer[0],sizeof(char),footer.size(),fp);
        fclose(fp);
    }